

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeFunctionBody.cpp
# Opt level: O1

bool __thiscall JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(JITTimeFunctionBody *this)

{
  return false;
}

Assistant:

bool JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer() const
{
    // Using Fast Virtual Buffer means that bounds checks can be omitted
#if ENABLE_FAST_ARRAYBUFFER
#ifdef ENABLE_WASM
    if (IsWasmFunction())
    {
        return CONFIG_FLAG(WasmFastArray);
    }
#endif
    return true;
#else
    return false;
#endif
}